

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaBackend.cpp
# Opt level: O2

void __thiscall xmrig::CudaBackend::~CudaBackend(CudaBackend *this)

{
  int __fd;
  CudaBackendPrivate *this_00;
  
  (this->super_IBackend)._vptr_IBackend = (_func_int **)&PTR__CudaBackend_001bc3b0;
  this_00 = this->d_ptr;
  if (this_00 != (CudaBackendPrivate *)0x0) {
    CudaBackendPrivate::~CudaBackendPrivate(this_00);
  }
  operator_delete(this_00);
  __fd = (int)this_00;
  CudaLib::close(__fd);
  NvmlLib::close(__fd);
  return;
}

Assistant:

xmrig::CudaBackend::~CudaBackend()
{
    delete d_ptr;

    CudaLib::close();

#   ifdef XMRIG_FEATURE_NVML
    NvmlLib::close();
#   endif
}